

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O1

unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> __thiscall
dtc::input_buffer::buffer_for_file(input_buffer *this,string *path,bool warn)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  undefined8 extraout_RAX;
  pointer *__ptr;
  stat st;
  long *local_170;
  long local_168;
  long local_160 [2];
  stat local_150;
  stat local_c0;
  
  iVar2 = std::__cxx11::string::compare((char *)path);
  if (iVar2 == 0) {
    pp_Var4 = (_func_int **)operator_new(0x30);
    pp_Var4[1] = (_func_int *)0x0;
    pp_Var4[2] = (_func_int *)0x0;
    *pp_Var4 = (_func_int *)&PTR_filename_abi_cxx11__00149cc0;
    pp_Var4[3] = (_func_int *)0x0;
    pp_Var4[4] = (_func_int *)0x0;
    pp_Var4[5] = (_func_int *)0x0;
    iVar2 = fgetc(_stdin);
    if (iVar2 != -1) {
      do {
        local_150.st_dev._0_1_ = (undefined1)iVar2;
        std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  ((vector<char,_std::allocator<char>_> *)(pp_Var4 + 3),(char *)&local_150);
        iVar2 = fgetc(_stdin);
      } while (iVar2 != -1);
    }
    pp_Var4[1] = pp_Var4[3];
    *(int *)(pp_Var4 + 2) = *(int *)(pp_Var4 + 4) - (int)pp_Var4[3];
    this->_vptr_input_buffer = pp_Var4;
  }
  else {
    iVar2 = open((path->_M_dataplus)._M_p,0);
    if (iVar2 == -1) {
      if (warn) {
        buffer_for_file((input_buffer *)path);
      }
    }
    else {
      iVar3 = fstat(iVar2,&local_c0);
      if ((iVar3 != 0) || ((local_c0.st_mode & 0xf000) != 0x4000)) {
        pp_Var4 = (_func_int **)operator_new(0x38);
        pcVar1 = (path->_M_dataplus)._M_p;
        local_170 = local_160;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,pcVar1,pcVar1 + path->_M_string_length);
        pp_Var4[1] = (_func_int *)0x0;
        pp_Var4[2] = (_func_int *)0x0;
        *pp_Var4 = (_func_int *)&PTR_filename_abi_cxx11__00149d00;
        pp_Var4[3] = (_func_int *)(pp_Var4 + 5);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(pp_Var4 + 3),local_170,local_168 + (long)local_170);
        iVar3 = fstat(iVar2,&local_150);
        if (iVar3 != 0) {
          perror("Failed to stat file");
        }
        *(int *)(pp_Var4 + 2) = (int)local_150.st_size;
        p_Var5 = (_func_int *)mmap((void *)0x0,(long)(int)local_150.st_size,1,2,iVar2,0);
        pp_Var4[1] = p_Var5;
        if (p_Var5 != (_func_int *)0xffffffffffffffff) {
          this->_vptr_input_buffer = pp_Var4;
          if (local_170 != local_160) {
            operator_delete(local_170,local_160[0] + 1);
          }
          close(iVar2);
          return (__uniq_ptr_data<dtc::input_buffer,_std::default_delete<dtc::input_buffer>,_true,_true>
                  )(__uniq_ptr_data<dtc::input_buffer,_std::default_delete<dtc::input_buffer>,_true,_true>
                    )this;
        }
        buffer_for_file();
        (**(code **)(*pp_Var4 + 0x10))(pp_Var4);
        this->_vptr_input_buffer = (_func_int **)0x0;
        _Unwind_Resume(extraout_RAX);
      }
      if (warn) {
        buffer_for_file((input_buffer *)path);
      }
      close(iVar2);
    }
    this->_vptr_input_buffer = (_func_int **)0x0;
  }
  return (__uniq_ptr_data<dtc::input_buffer,_std::default_delete<dtc::input_buffer>,_true,_true>)
         (__uniq_ptr_data<dtc::input_buffer,_std::default_delete<dtc::input_buffer>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<input_buffer>
input_buffer::buffer_for_file(const string &path, bool warn)
{
	if (path == "-")
	{
		std::unique_ptr<input_buffer> b(new stream_input_buffer());
		return b;
	}
	int source = open(path.c_str(), O_RDONLY);
	if (source == -1)
	{
		if (warn)
		{
			fprintf(stderr, "Unable to open file '%s'.  %s\n", path.c_str(), strerror(errno));
		}
		return 0;
	}
	struct stat st;
	if (fstat(source, &st) == 0 && S_ISDIR(st.st_mode))
	{
		if (warn)
		{
			fprintf(stderr, "File %s is a directory\n", path.c_str());
		}
		close(source);
		return 0;
	}
	std::unique_ptr<input_buffer> b(new mmap_input_buffer(source, string(path)));
	close(source);
	return b;
}